

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::WriteWatchOnly(WalletBatch *this,CScript *dest,CKeyMetadata *keyMeta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long in_FS_OFFSET;
  uchar local_71;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
  local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript,_true>
            (&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DBKeys::WATCHMETA_abi_cxx11_,dest);
  bVar2 = WriteIC<std::pair<std::__cxx11::string,CScript>,wallet::CKeyMetadata>
                    (this,&local_70,keyMeta,true);
  if (0x1c < local_70.second.super_CScriptBase._size) {
    free(local_70.second.super_CScriptBase._union.indirect_contents.indirect);
    local_70.second.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  paVar1 = &local_70.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (bVar2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript,_true>
              (&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DBKeys::WATCHS_abi_cxx11_,dest);
    local_71 = '1';
    bVar2 = WriteIC<std::pair<std::__cxx11::string,CScript>,unsigned_char>
                      (this,&local_70,&local_71,true);
    if (0x1c < local_70.second.super_CScriptBase._size) {
      free(local_70.second.super_CScriptBase._union.indirect_contents.indirect);
      local_70.second.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.first._M_dataplus._M_p,
                      local_70.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteWatchOnly(const CScript &dest, const CKeyMetadata& keyMeta)
{
    if (!WriteIC(std::make_pair(DBKeys::WATCHMETA, dest), keyMeta)) {
        return false;
    }
    return WriteIC(std::make_pair(DBKeys::WATCHS, dest), uint8_t{'1'});
}